

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effect-handler-attack.c
# Opt level: O2

_Bool effect_handler_DESTRUCTION(effect_handler_context_t *context)

{
  ulong uVar1;
  wchar_t wVar2;
  wchar_t wVar3;
  int x;
  int y;
  player_upkeep *ppVar4;
  player *ppVar5;
  _Bool _Var6;
  wchar_t wVar7;
  uint32_t uVar8;
  loc_conflict grid1;
  square *psVar9;
  object *obj;
  wchar_t wVar10;
  loc grid;
  artifact *artifact;
  wchar_t wVar11;
  
  ppVar5 = player;
  wVar2 = context->subtype;
  wVar3 = context->radius;
  x = (player->grid).x;
  y = (player->grid).y;
  context->ident = true;
  if ((ppVar5->depth == 0) || (ppVar5->upkeep->arena_level == true)) {
    msg("The ground shakes for a moment.");
    return true;
  }
  for (wVar10 = y - wVar3; wVar11 = x - wVar3, wVar10 <= y + wVar3; wVar10 = wVar10 + L'\x01') {
    for (; wVar11 <= x + wVar3; wVar11 = wVar11 + L'\x01') {
      grid.y = wVar10;
      grid.x = wVar11;
      _Var6 = square_in_bounds_fully(cave,grid);
      if (_Var6) {
        grid1 = loc(x,y);
        wVar7 = distance(grid1,(loc_conflict)grid);
        if (wVar7 <= wVar3) {
          psVar9 = square(cave,grid);
          flag_off(psVar9->info,3,4);
          psVar9 = square(cave,grid);
          flag_off(psVar9->info,3,3);
          _Var6 = square_isbright(cave,grid);
          if (!_Var6) {
            psVar9 = square(cave,grid);
            flag_off(psVar9->info,3,2);
          }
          psVar9 = square(cave,grid);
          flag_off(psVar9->info,3,5);
          square_forget(cave,grid);
          square_light_spot((chunk *)cave,grid);
          _Var6 = loc_eq((loc_conflict)grid,player->grid);
          if (!_Var6) {
            delete_monster((chunk *)cave,(loc_conflict)grid);
            _Var6 = square_isstairs(cave,grid);
            if ((!_Var6) && (_Var6 = square_isperm(cave,grid), !_Var6)) {
              for (obj = square_object(cave,grid); obj != (object *)0x0; obj = obj->next) {
                artifact = obj->artifact;
                if (artifact != (artifact *)0x0) {
                  if ((player->opts).opt[0x24] == false) {
                    _Var6 = obj_is_known_artifact(obj);
                    if (_Var6) {
                      artifact = obj->artifact;
                      goto LAB_00139286;
                    }
                    _Var6 = false;
                  }
                  else {
LAB_00139286:
                    history_lose_artifact(player,artifact);
                    _Var6 = true;
                  }
                  mark_artifact_created(obj->artifact,_Var6);
                }
              }
              square_excise_all_imagined((chunk_conflict *)player->cave,cave,grid);
              square_excise_pile((chunk_conflict *)player->cave,grid);
              square_excise_pile(cave,grid);
              square_destroy(cave,grid);
            }
          }
        }
      }
    }
  }
  if (wVar2 == L'\x06') {
    msg("Darkness seems to crush you!");
    wVar2 = L'\x06';
  }
  else {
    if (wVar2 != L'\x05') goto LAB_00139372;
    msg("There is a searing blast of light!");
    wVar2 = L'\x05';
  }
  equip_learn_element(player,wVar2);
  _Var6 = player_resists(player,wVar2);
  ppVar5 = player;
  if (!_Var6) {
    uVar8 = Rand_div(10);
    player_inc_timed(ppVar5,L'\x02',uVar8 + L'\v',true,true,true);
  }
LAB_00139372:
  ppVar4 = player->upkeep;
  uVar1._0_4_ = ppVar4->update;
  uVar1._4_4_ = ppVar4->redraw;
  ppVar4->update = (int)(uVar1 | 0xc0000000000060);
  ppVar4->redraw = (int)((uVar1 | 0xc0000000000060) >> 0x20);
  return true;
}

Assistant:

bool effect_handler_DESTRUCTION(effect_handler_context_t *context)
{
	int k, r = context->radius;
	int elem = context->subtype;
	int py = player->grid.y;
	int px = player->grid.x;
	struct loc grid;

	context->ident = true;

	/* No effect in town or arena */
	if ((!player->depth) || (player->upkeep->arena_level)) {
		msg("The ground shakes for a moment.");
		return true;
	}

	/* Big area of affect */
	for (grid.y = (py - r); grid.y <= (py + r); grid.y++) {
		for (grid.x = (px - r); grid.x <= (px + r); grid.x++) {
			/* Skip illegal grids */
			if (!square_in_bounds_fully(cave, grid)) continue;

			/* Extract the distance */
			k = distance(loc(px, py), grid);

			/* Stay in the circle of death */
			if (k > r) continue;

			/* Lose room and vault */
			sqinfo_off(square(cave, grid)->info, SQUARE_ROOM);
			sqinfo_off(square(cave, grid)->info, SQUARE_VAULT);

			/* Forget completely */
			if (!square_isbright(cave, grid)) {
				sqinfo_off(square(cave, grid)->info, SQUARE_GLOW);
			}
			sqinfo_off(square(cave, grid)->info, SQUARE_SEEN);
			square_forget(cave, grid);
			square_light_spot(cave, grid);

			/* Deal with player later */
			if (loc_eq(grid, player->grid)) continue;

			/* Delete the monster (if any) */
			delete_monster(cave, grid);

			/* Don't remove stairs */
			if (square_isstairs(cave, grid)) continue;

			/* Destroy any grid that isn't a permament wall */
			if (!square_isperm(cave, grid)) {
				/* Deal with artifacts */
				struct object *obj = square_object(cave, grid);
				while (obj) {
					if (obj->artifact) {
						if (OPT(player, birth_lose_arts) ||
							obj_is_known_artifact(obj)) {
							history_lose_artifact(player, obj->artifact);
							mark_artifact_created(
								obj->artifact,
								true);
						} else {
							mark_artifact_created(
								obj->artifact,
								false);
						}
					}
					obj = obj->next;
				}

				/* Delete objects */
				square_excise_all_imagined(player->cave, cave,
					grid);
				square_excise_pile(player->cave, grid);
				square_excise_pile(cave, grid);
				square_destroy(cave, grid);
			}
		}
	}

	/* Player is affected */
	if (elem == ELEM_LIGHT) {
		msg("There is a searing blast of light!");
		equip_learn_element(player, ELEM_LIGHT);
		if (!player_resists(player, ELEM_LIGHT)) {
			(void)player_inc_timed(player, TMD_BLIND,
				10 + randint1(10), true, true, true);
		}
	} else if (elem == ELEM_DARK) {
		msg("Darkness seems to crush you!");
		equip_learn_element(player, ELEM_DARK);
		if (!player_resists(player, ELEM_DARK)) {
			(void)player_inc_timed(player, TMD_BLIND,
				10 + randint1(10), true, true, true);
		}
	}

	/* Fully update the visuals */
	player->upkeep->update |= (PU_UPDATE_VIEW | PU_MONSTERS);

	/* Redraw monster list */
	player->upkeep->redraw |= (PR_MONLIST | PR_ITEMLIST);

	return true;
}